

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

GenericVecType deqp::gls::ContextShaderProgram::mapOutputType(OutputType *type)

{
  OutputType OVar1;
  OutputType *type_local;
  
  OVar1 = *type;
  if (OVar1 < OUTPUTTYPE_INT) {
    return GENERICVECTYPE_FLOAT;
  }
  if (OVar1 == OUTPUTTYPE_INT) {
LAB_00f71dbf:
    type_local._4_4_ = GENERICVECTYPE_INT32;
  }
  else {
    if (OVar1 != OUTPUTTYPE_UINT) {
      if (OVar1 - OUTPUTTYPE_IVEC2 < 3) goto LAB_00f71dbf;
      if (2 < OVar1 - OUTPUTTYPE_UVEC2) {
        return GENERICVECTYPE_LAST;
      }
    }
    type_local._4_4_ = GENERICVECTYPE_UINT32;
  }
  return type_local._4_4_;
}

Assistant:

rr::GenericVecType ContextShaderProgram::mapOutputType (const Array::OutputType& type)
{
	switch (type)
	{
		case (Array::OUTPUTTYPE_FLOAT):
		case (Array::OUTPUTTYPE_VEC2):
		case (Array::OUTPUTTYPE_VEC3):
		case (Array::OUTPUTTYPE_VEC4):
			return rr::GENERICVECTYPE_FLOAT;

		case (Array::OUTPUTTYPE_INT):
		case (Array::OUTPUTTYPE_IVEC2):
		case (Array::OUTPUTTYPE_IVEC3):
		case (Array::OUTPUTTYPE_IVEC4):
			return rr::GENERICVECTYPE_INT32;

		case (Array::OUTPUTTYPE_UINT):
		case (Array::OUTPUTTYPE_UVEC2):
		case (Array::OUTPUTTYPE_UVEC3):
		case (Array::OUTPUTTYPE_UVEC4):
			return rr::GENERICVECTYPE_UINT32;

		default:
			DE_ASSERT(false);
			return rr::GENERICVECTYPE_LAST;
	}
}